

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry_&>
__thiscall
kj::
Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>>
::find<0ul,unsigned_int&>
          (Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>>
           *this,uint *params)

{
  long lVar1;
  ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
  table;
  HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>
  local_28 [8];
  long local_20;
  
  table.ptr = (Entry *)(params + 8);
  table.size_ = *(size_t *)params;
  HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>
  ::
  find<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry,unsigned_int&>
            (local_28,table,(uint *)((long)(*(long *)(params + 2) - *(size_t *)params) >> 6));
  if (local_28[0] ==
      (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>
       )0x1) {
    lVar1 = local_20 * 0x40 + *(long *)params;
  }
  else {
    lVar1 = 0;
  }
  *(long *)this = lVar1;
  return (Maybe<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry_&>
          )(Entry *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}